

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitSVTest_single_word_prefix_delim_Test<char32_t>::TestBody
          (SplitSVTest_single_word_prefix_delim_Test<char32_t> *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  split_result;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> word;
  long *local_70;
  int local_68 [2];
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_50;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = L'\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_30,L'\0');
  make_word<char32_t,std::__cxx11::u32string>(&local_50,8,L'\0');
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  _M_append(&local_30,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
  }
  jessilib::split<std::vector,_const_char32_t_*,_const_char32_t_*,_char32_t>
            ((container_type_conflict5 *)&local_50,local_30._M_dataplus._M_p,
             local_30._M_dataplus._M_p + local_30._M_string_length,L'\0');
  local_70 = (long *)((long)(local_50._M_string_length - (long)local_50._M_dataplus._M_p) >> 5);
  local_68[0] = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_60,"split_result.size()","2",(unsigned_long *)&local_70,local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70 = *(long **)(local_50._M_dataplus._M_p + 2);
  local_68[0] = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_60,"split_result[0].size()","0",(unsigned_long *)&local_70,local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70 = *(long **)(local_50._M_dataplus._M_p + 10);
  local_68[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_60,"split_result[1].size()","8",(unsigned_long *)&local_70,local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x51,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT44(local_30.field_2._M_local_buf[1],local_30.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, empty_long) {
	std::basic_string<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>(8);
	std::vector<decltype(empty)> split_result = split(empty, delim);
	EXPECT_TRUE(split_result.empty());
}